

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

bool S_GetSoundPlayingInfo(sector_t *sec,int sound_id)

{
  FSoundChan *pFVar1;
  
  pFVar1 = Channels;
  if (Channels != (FSoundChan *)0x0 && 0 < sound_id) {
    do {
      if ((((pFVar1->OrgID).ID == sound_id) && (pFVar1->SourceType == '\x02')) &&
         ((pFVar1->field_12).Actor == (AActor *)sec)) {
        return true;
      }
      pFVar1 = pFVar1->NextChan;
    } while (pFVar1 != (FSoundChan *)0x0);
  }
  return false;
}

Assistant:

bool S_GetSoundPlayingInfo (const sector_t *sec, int sound_id)
{
	if (sound_id > 0)
	{
		for (FSoundChan *chan = Channels; chan != NULL; chan = chan->NextChan)
		{
			if (chan->OrgID == sound_id &&
				chan->SourceType == SOURCE_Sector &&
				chan->Sector == sec)
			{
				return true;
			}
		}
	}
	return false;
}